

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr162.cpp
# Opt level: O0

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  IkReal x53;
  IkReal x52;
  IkReal x51;
  IkReal x50;
  IkReal x49;
  IkReal x48;
  IkReal x47;
  IkReal x46;
  IkReal x45;
  IkReal x44;
  IkReal x43;
  IkReal x42;
  IkReal x41;
  IkReal x40;
  IkReal x39;
  IkReal x38;
  IkReal x37;
  IkReal x36;
  IkReal x35;
  IkReal x34;
  IkReal x33;
  IkReal x32;
  IkReal x31;
  IkReal x30;
  IkReal x29;
  IkReal x28;
  IkReal x27;
  IkReal x26;
  IkReal x25;
  IkReal x24;
  IkReal x23;
  IkReal x22;
  IkReal x21;
  IkReal x20;
  IkReal x19;
  IkReal x18;
  IkReal x17;
  IkReal x16;
  IkReal x15;
  IkReal x14;
  IkReal x13;
  IkReal x12;
  IkReal x11;
  IkReal x10;
  IkReal x9;
  IkReal x8;
  IkReal x7;
  IkReal x6;
  IkReal x5;
  IkReal x4;
  IkReal x3;
  IkReal x2;
  IkReal x1;
  IkReal x0;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IkReal *j_local;
  
  dVar1 = IKcos(*j);
  dVar2 = IKcos(j[1]);
  dVar3 = IKsin(j[2]);
  dVar4 = IKcos(j[2]);
  dVar5 = IKsin(j[1]);
  dVar6 = IKsin(j[3]);
  dVar7 = IKcos(j[3]);
  dVar8 = IKsin(*j);
  dVar9 = IKsin(j[4]);
  dVar10 = IKcos(j[4]);
  dVar11 = IKsin(j[5]);
  dVar12 = IKcos(j[5]);
  dVar13 = dVar7 * 1.0;
  dVar14 = dVar1 * 0.158;
  dVar15 = dVar3 * 0.035;
  dVar16 = dVar8 * 1.0;
  dVar17 = dVar8 * 0.158;
  dVar18 = dVar3 * 1.0;
  dVar19 = dVar2 * dVar4;
  dVar4 = dVar4 * dVar5;
  dVar20 = dVar3 * dVar5;
  dVar21 = dVar1 * dVar2;
  dVar3 = dVar2 * dVar3;
  dVar22 = dVar20 - dVar19;
  dVar23 = dVar1 * (dVar18 * -1.0 * dVar5 + dVar19);
  dVar24 = dVar19 * dVar8 - dVar16 * dVar20;
  dVar25 = dVar1 * 1.0 * -1.0 * dVar4 + dVar18 * -1.0 * dVar21;
  dVar26 = dVar16 * (dVar4 * -1.0 - dVar3);
  dVar27 = dVar23 * dVar9;
  dVar28 = dVar25 * dVar6 + dVar7 * dVar8;
  dVar29 = dVar1 * 1.0 * -1.0 * dVar6 + dVar13 * -1.0 * dVar26;
  dVar30 = (dVar13 * -1.0 * dVar25 + dVar16 * dVar6) * dVar10;
  *eerot = dVar23 * dVar10 + dVar9 * (dVar25 * dVar7 - dVar16 * dVar6);
  eerot[1] = dVar12 * dVar28 + dVar11 * (dVar30 * -1.0 - dVar27);
  eerot[2] = dVar11 * dVar28 + dVar12 * (dVar27 + dVar30);
  *eetrans = dVar1 * 0.26 +
             dVar21 * 0.68 +
             dVar1 * 0.67 * dVar19 +
             dVar15 * -1.0 * dVar21 +
             dVar1 * 0.67 * -1.0 * dVar20 * 1.0 +
             dVar9 * (dVar17 * -1.0 * dVar6 + dVar7 * 0.158 * dVar25) +
             dVar1 * -0.035 * dVar4 + dVar10 * (dVar14 * -1.0 * dVar20 * 1.0 + dVar14 * dVar19);
  eerot[3] = dVar29 * dVar9 + dVar10 * (dVar16 * -1.0 * dVar19 + dVar16 * dVar20);
  eerot[4] = dVar11 * (dVar29 * dVar10 + dVar24 * dVar9) +
             dVar12 * (dVar1 * dVar13 - dVar26 * dVar6);
  eerot[5] = dVar11 * (dVar1 * dVar13 - dVar26 * dVar6) +
             dVar12 * (dVar9 * -1.0 * dVar24 +
                      dVar10 * -1.0 * (dVar26 * -1.0 * dVar7 + dVar1 * dVar6 * -1.0));
  eetrans[1] = dVar8 * 0.67 * dVar20 +
               dVar4 * 0.035 * dVar8 +
               dVar10 * (dVar17 * dVar20 + dVar17 * -1.0 * dVar19 * 1.0) +
               dVar2 * dVar8 * -0.68 +
               dVar8 * 0.67 * -1.0 * dVar19 * 1.0 +
               dVar15 * dVar2 * dVar8 +
               dVar9 * (dVar7 * 0.158 * -1.0 * dVar26 + dVar14 * -1.0 * dVar6) + dVar8 * -0.26;
  eerot[6] = dVar7 * dVar9 * dVar22 + dVar10 * (dVar2 * -1.0 * dVar18 - dVar4);
  eerot[7] = dVar12 * dVar22 * dVar6 + dVar11 * ((dVar3 + dVar4) * dVar9 + dVar22 * dVar7 * dVar10);
  eerot[8] = dVar11 * dVar22 * dVar6 +
             dVar12 * (dVar9 * -1.0 * (dVar3 + dVar4) + dVar10 * -1.0 * dVar22 * dVar7);
  eetrans[2] = dVar4 * -0.67 +
               dVar5 * -0.68 +
               dVar10 * (dVar3 * -0.158 + dVar4 * -0.158) +
               dVar15 * dVar5 +
               dVar3 * -0.67 +
               dVar19 * -0.035 + dVar7 * dVar9 * (dVar20 * 0.158 + dVar19 * -0.158) + 0.675;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50,x51;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.67)*x0);
x13=((1.0)*x6);
x14=((0.158)*x6);
x15=((0.158)*x0);
x16=((0.035)*x2);
x17=((1.0)*x7);
x18=((0.158)*x7);
x19=((1.0)*x2);
x20=((0.67)*x7);
x21=((1.0)*x0);
x22=(x0*x5);
x23=(x1*x3);
x24=(x3*x4);
x25=((-1.0)*x9);
x26=((-1.0)*x8);
x27=(x6*x8);
x28=(x2*x4);
x29=(x1*x7);
x30=(x0*x1);
x31=(x1*x2);
x32=(x17*x5);
x33=(x0*x13);
x34=(x17*x28);
x35=((((-1.0)*x23))+x28);
x36=(x31+x24);
x37=(x35*x5);
x38=(x35*x6);
x39=(x0*(((((-1.0)*x19*x4))+x23)));
x40=((((-1.0)*x34))+((x23*x7)));
x41=(x38*x9);
x42=((((-1.0)*x21*x24))+(((-1.0)*x19*x30)));
x43=(x17*(((((-1.0)*x31))+(((-1.0)*x24)))));
x44=(x39*x8);
x45=(x42*x6);
x46=(x43*x5);
x47=((-1.0)*x43);
x48=(((x42*x5))+((x6*x7)));
x49=(x32+(((-1.0)*x13*x42)));
x50=((((-1.0)*x21*x5))+(((-1.0)*x13*x43)));
x51=(x49*x9);
eerot[0]=(((x39*x9))+((x8*(((((-1.0)*x32))+x45)))));
eerot[1]=(((x11*x48))+((x10*(((((-1.0)*x44))+(((-1.0)*x51)))))));
eerot[2]=(((x10*x48))+((x11*((x44+x51)))));
IkReal x52=((1.0)*x28);
eetrans[0]=((((-0.035)*x0*x24))+((x9*(((((-1.0)*x15*x52))+((x15*x23))))))+((x8*(((((-1.0)*x18*x5))+((x14*x42))))))+(((-1.0)*x12*x52))+(((-1.0)*x16*x30))+((x12*x23))+(((0.68)*x30))+(((0.26)*x0)));
eerot[3]=(((x50*x8))+((x9*(((((-1.0)*x17*x23))+x34)))));
eerot[4]=(((x10*((((x50*x9))+((x40*x8))))))+((x11*(((((-1.0)*x46))+x33)))));
eerot[5]=(((x10*(((((-1.0)*x46))+x33))))+((x11*((((x26*x40))+((x25*((((x47*x6))+(((-1.0)*x22)))))))))));
IkReal x53=((1.0)*x23);
eetrans[1]=(((x8*(((((-1.0)*x14*x43))+(((-1.0)*x15*x5))))))+(((-0.26)*x7))+((x16*x29))+(((-1.0)*x20*x53))+(((-0.68)*x29))+((x9*((((x18*x28))+(((-1.0)*x18*x53))))))+(((0.035)*x24*x7))+((x20*x28)));
eerot[6]=(((x27*x35))+((x9*(((((-1.0)*x24))+(((-1.0)*x1*x19)))))));
eerot[7]=(((x11*x37))+((x10*((x41+((x36*x8)))))));
eerot[8]=(((x10*x37))+((x11*((((x26*x36))+((x25*x38)))))));
eetrans[2]=((0.675)+((x27*(((((0.158)*x28))+(((-0.158)*x23))))))+(((-0.035)*x23))+(((-0.67)*x31))+((x16*x4))+((x9*(((((-0.158)*x31))+(((-0.158)*x24))))))+(((-0.68)*x4))+(((-0.67)*x24)));
}